

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O0

void QXkbCommon::verifyHasLatinLayout(xkb_keymap *keymap)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  xkb_keycode_t code;
  xkb_layout_index_t layout;
  int nrLatinKeys;
  xkb_keycode_t maxKeycode;
  xkb_keycode_t minKeycode;
  xkb_layout_index_t layoutCount;
  xkb_keysym_t *keysyms;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  uint line;
  int iVar5;
  uint uVar6;
  char local_40 [32];
  xkb_keysym_t *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = xkb_keymap_num_layouts(in_RDI);
  uVar3 = xkb_keymap_min_keycode(in_RDI);
  uVar4 = xkb_keymap_max_keycode(in_RDI);
  local_20 = (xkb_keysym_t *)0x0;
  iVar5 = 0;
  for (line = 0; uVar6 = uVar3, line < uVar2; line = line + 1) {
    for (; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      xkb_keymap_key_get_syms_by_level(in_RDI,uVar3,line,0,&local_20);
      if ((local_20 != (xkb_keysym_t *)0x0) && (bVar1 = isLatin1(*local_20), bVar1)) {
        iVar5 = iVar5 + 1;
      }
      if (10 < iVar5) goto LAB_00b3ff99;
    }
    in_stack_ffffffffffffffa0 = uVar3;
    uVar3 = uVar6;
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QtPrivateLogging::lcQpaKeyMapper();
  anon_unknown.dwarf_1fe24f5::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)CONCAT44(line,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_1fe24f5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb3ff69);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(uVar2,uVar3),(char *)CONCAT44(uVar4,iVar5),line,
               (char *)in_stack_ffffffffffffff98,(char *)0xb3ff7f);
    QMessageLogger::debug(local_40,"no keyboard layouts with latin keys present");
    local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
  }
LAB_00b3ff99:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXkbCommon::verifyHasLatinLayout(xkb_keymap *keymap)
{
    const xkb_layout_index_t layoutCount = xkb_keymap_num_layouts(keymap);
    const xkb_keycode_t minKeycode = xkb_keymap_min_keycode(keymap);
    const xkb_keycode_t maxKeycode = xkb_keymap_max_keycode(keymap);

    const xkb_keysym_t *keysyms = nullptr;
    int nrLatinKeys = 0;
    for (xkb_layout_index_t layout = 0; layout < layoutCount; ++layout) {
        for (xkb_keycode_t code = minKeycode; code < maxKeycode; ++code) {
            xkb_keymap_key_get_syms_by_level(keymap, code, layout, 0, &keysyms);
            if (keysyms && isLatin1(keysyms[0]))
                nrLatinKeys++;
            if (nrLatinKeys > 10) // arbitrarily chosen threshold
                return;
        }
    }
    // This means that lookupLatinKeysym() will not find anything and latin
    // key shortcuts might not work. This is a bug in the affected desktop
    // environment. Usually can be solved via system settings by adding e.g. 'us'
    // layout to the list of selected layouts, or by using command line, "setxkbmap
    // -layout rus,en". The position of latin key based layout in the list of the
    // selected layouts is irrelevant. Properly functioning desktop environments
    // handle this behind the scenes, even if no latin key based layout has been
    // explicitly listed in the selected layouts.
    qCDebug(lcQpaKeyMapper, "no keyboard layouts with latin keys present");
}